

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

ostream * __thiscall nivalis::DrawBufferObject::to_bin(DrawBufferObject *this,ostream *os)

{
  pointer paVar1;
  ostream *os_00;
  size_t i;
  ulong uVar2;
  int i_1;
  long lVar3;
  array<double,_2UL> val;
  
  os_00 = (ostream *)
          ((long)(this->points).
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->points).
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4);
  util::write_bin<unsigned_long>(os,(unsigned_long)os_00);
  lVar3 = 8;
  for (uVar2 = 0;
      paVar1 = (this->points).
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->points).
                            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 4);
      uVar2 = uVar2 + 1) {
    val._M_elems[1] = *(double *)((long)paVar1->_M_elems + lVar3);
    val._M_elems[0] = *(double *)((long)paVar1->_M_elems + lVar3 + -8);
    util::write_bin<std::array<double,2ul>>((util *)os,os_00,val);
    lVar3 = lVar3 + 0x10;
  }
  util::write_bin<float>(os,this->thickness);
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    util::write_bin<float>(os,(this->c).data[lVar3]);
  }
  util::write_bin<unsigned_long>(os,this->rel_func);
  util::write_bin<nivalis::DrawBufferObject::_unnamed_type_1_>(os,this->type);
  util::write_bin<unsigned_long>(os,(this->str)._M_string_length);
  std::ostream::write((char *)os,(long)(this->str)._M_dataplus._M_p);
  return os;
}

Assistant:

std::ostream& DrawBufferObject::to_bin(std::ostream& os) const {
    util::write_bin(os, points.size());
    for (size_t i = 0; i < points.size(); ++i) {
        util::write_bin(os, points[i]);
    }
    util::write_bin(os, thickness);
    for (int i = 0; i < 4; ++i) util::write_bin(os, c.data[i]);
    util::write_bin(os, rel_func);
    util::write_bin(os, type);
    util::write_bin(os, str.size());
    os.write(str.c_str(), str.size());
    return os;
}